

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlockfile_unix.cpp
# Opt level: O0

bool QLockFilePrivate::isProcessRunning(qint64 pid,QString *appname)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  byte bVar4;
  int iVar5;
  int *piVar6;
  QFileInfo *in_RSI;
  __pid_t in_EDI;
  long in_FS_OFFSET;
  QFileInfo fi;
  QString processName;
  QString *in_stack_ffffffffffffff68;
  QString *in_stack_ffffffffffffff70;
  undefined5 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  undefined4 in_stack_ffffffffffffff80;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff84;
  QString *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffffa0;
  byte in_stack_ffffffffffffffa7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = kill(in_EDI,0);
  if ((iVar5 == -1) && (piVar6 = __errno_location(), *piVar6 == 3)) {
    in_stack_ffffffffffffffa7 = 0;
    goto LAB_006ac792;
  }
  processNameByPid(CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  bVar2 = QString::isEmpty((QString *)0x6ac640);
  if (bVar2) {
LAB_006ac76d:
    in_stack_ffffffffffffffa7 = 1;
  }
  else {
    QFileInfo::QFileInfo(in_RSI,in_stack_ffffffffffffff88);
    uVar3 = QFileInfo::isSymLink(in_RSI);
    if ((bool)uVar3) {
      QFileInfo::symLinkTarget((QFileInfo *)in_stack_ffffffffffffff88);
      QFileInfo::setFile((QFileInfo *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         (QString *)
                         CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff7e,
                                                 CONCAT15(in_stack_ffffffffffffff7d,
                                                          in_stack_ffffffffffffff78))));
      QString::~QString((QString *)0x6ac6ae);
    }
    QFileInfo::fileName((QFileInfo *)in_stack_ffffffffffffff88);
    bVar4 = ::operator!=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QString::~QString((QString *)0x6ac72a);
    bVar2 = (bVar4 & 1) != 0;
    if (bVar2) {
      in_stack_ffffffffffffffa7 = 0;
    }
    uVar7 = (uint)bVar2;
    QFileInfo::~QFileInfo((QFileInfo *)0x6ac755);
    if (uVar7 == 0) goto LAB_006ac76d;
  }
  QString::~QString((QString *)0x6ac784);
LAB_006ac792:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(in_stack_ffffffffffffffa7 & 1);
}

Assistant:

bool QLockFilePrivate::isProcessRunning(qint64 pid, const QString &appname)
{
    if (::kill(pid_t(pid), 0) == -1 && errno == ESRCH)
        return false; // PID doesn't exist anymore

    const QString processName = processNameByPid(pid);
    if (!processName.isEmpty()) {
        QFileInfo fi(appname);
        if (fi.isSymLink())
            fi.setFile(fi.symLinkTarget());
        if (processName != fi.fileName())
            return false;   // PID got reused by a different application.
    }

    return true;
}